

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Allocation * __thiscall
google::protobuf::DescriptorPool::Tables::
CreateFlatAlloc<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
          (Tables *this,
          TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          *sizes)

{
  pointer *ppuVar1;
  int iVar2;
  int iVar3;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *puVar4;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  IntT<google::protobuf::SourceCodeInfo> IVar9;
  FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pFVar10;
  long lVar11;
  undefined8 *puVar12;
  ulong uVar13;
  pointer puVar14;
  int iVar15;
  IntT<std::__cxx11::basic_string<char>_> IVar16;
  undefined1 *puVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  Base<char> BVar27;
  int iVar28;
  int iVar29;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *this_00;
  int iVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
  *this_01;
  int iVar38;
  pointer puVar39;
  int iVar40;
  SourceCodeInfo *this_02;
  FeatureSet *this_03;
  MessageOptions *this_04;
  FieldOptions *this_05;
  EnumOptions *this_06;
  EnumValueOptions *this_07;
  ExtensionRangeOptions *this_08;
  OneofOptions *this_09;
  ServiceOptions *this_10;
  MethodOptions *this_11;
  FileOptions *this_12;
  size_t __n;
  
  iVar2 = (sizes->payload_).super_Base<char>.value;
  iVar6 = (sizes->payload_).
          super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .value * 0x20;
  iVar3 = (sizes->payload_).super_Base<google::protobuf::SourceCodeInfo>.value;
  iVar35 = (sizes->payload_).super_Base<google::protobuf::FileDescriptorTables>.value * 200;
  iVar32 = (sizes->payload_).super_Base<google::protobuf::MessageOptions>.value * 0x58;
  iVar33 = (sizes->payload_).super_Base<google::protobuf::FieldOptions>.value * 0x98;
  iVar19 = (sizes->payload_).super_Base<google::protobuf::FeatureSet>.value * 0x50;
  iVar36 = (sizes->payload_).super_Base<google::protobuf::EnumOptions>.value * 0x58;
  iVar28 = (sizes->payload_).super_Base<google::protobuf::EnumValueOptions>.value * 0x60;
  iVar40 = (sizes->payload_).super_Base<google::protobuf::ExtensionRangeOptions>.value * 0x70;
  iVar7 = (sizes->payload_).super_Base<google::protobuf::ServiceOptions>.value * 0x58;
  iVar15 = (sizes->payload_).super_Base<google::protobuf::MethodOptions>.value * 0x58;
  iVar30 = (sizes->payload_).super_Base<google::protobuf::FileOptions>.value * 0xb0;
  iVar29 = (sizes->payload_).super_Base<google::protobuf::OneofOptions>.value * 0x50;
  iVar38 = iVar6 + iVar2 + iVar3 * 0x48;
  iVar37 = iVar35 + iVar38;
  iVar34 = iVar19 + iVar37;
  iVar20 = iVar32 + iVar34;
  iVar21 = iVar33 + iVar20;
  iVar22 = iVar36 + iVar21;
  iVar23 = iVar28 + iVar22;
  iVar24 = iVar40 + iVar23;
  iVar25 = iVar24 + iVar29;
  iVar26 = iVar25 + iVar7;
  iVar8 = iVar15 + iVar26;
  pFVar10 = (FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             *)operator_new((long)(iVar8 + iVar30) + 0x38);
  IVar9 = iVar6 + iVar2 + iVar3 * 0x48 + 0x38;
  BVar27.value = iVar2 + 0x38;
  (pFVar10->ends_).payload_.super_Base<char>.value = BVar27.value;
  IVar16 = iVar6 + 0x38 + iVar2;
  (pFVar10->ends_).payload_.
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = IVar16;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value = IVar9;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
       iVar35 + 0x38 + iVar38;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value = iVar19 + 0x38 + iVar37;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value =
       iVar32 + 0x38 + iVar34;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value =
       iVar33 + 0x38 + iVar20;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value = iVar36 + 0x38 + iVar21
  ;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value =
       iVar28 + 0x38 + iVar22;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value =
       iVar40 + 0x38 + iVar23;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value =
       iVar29 + 0x38 + iVar24;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value =
       iVar7 + 0x38 + iVar25;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value =
       iVar15 + 0x38 + iVar26;
  uVar31 = iVar8 + iVar30 + 0x38;
  __n = (size_t)uVar31;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FileOptions>.value = uVar31;
  if (iVar6 != 0) {
    lVar11 = (long)IVar16 - (long)BVar27.value;
    puVar17 = (undefined1 *)
              ((long)&(pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value +
              (long)BVar27.value);
    do {
      *(undefined1 **)(puVar17 + -0x10) = puVar17;
      *(undefined8 *)(puVar17 + -8) = 0;
      *puVar17 = 0;
      puVar17 = puVar17 + 0x20;
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != 0);
    IVar16 = (pFVar10->ends_).payload_.
             super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .value;
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
  }
  if (IVar16 != IVar9) {
    this_02 = (SourceCodeInfo *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar16);
    lVar11 = (long)IVar9 - (long)IVar16;
    do {
      __n = 0;
      SourceCodeInfo::SourceCodeInfo(this_02,(Arena *)0x0);
      this_02 = this_02 + 1;
      lVar11 = lVar11 + -0x48;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  if (IVar9 != iVar2) {
    puVar12 = (undefined8 *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    __n = 0;
    do {
      *puVar12 = 1;
      puVar12[1] = 0;
      puVar12[4] = 0;
      puVar12[5] = 0;
      puVar12[6] = 0;
      puVar12[7] = 1;
      puVar12[8] = 0;
      puVar12[0xb] = 1;
      puVar12[0xc] = 0;
      puVar12[0xf] = 1;
      puVar12[0x10] = 0;
      *(undefined4 *)(puVar12 + 0x13) = 0;
      puVar12[0x14] = 0;
      puVar12[0x15] = 0;
      puVar12[0x16] = 0x3b0b40;
      puVar12[0x18] = 0;
      puVar12 = puVar12 + 0x19;
    } while (puVar12 !=
             (undefined8 *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2));
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value;
  if (IVar9 != iVar2) {
    this_03 = (FeatureSet *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      FeatureSet::FeatureSet(this_03,(Arena *)0x0);
      this_03 = this_03 + 1;
      lVar11 = lVar11 + -0x50;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value;
  if (IVar9 != iVar2) {
    this_04 = (MessageOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      MessageOptions::MessageOptions(this_04,(Arena *)0x0);
      this_04 = this_04 + 1;
      lVar11 = lVar11 + -0x58;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value;
  if (IVar9 != iVar2) {
    this_05 = (FieldOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      FieldOptions::FieldOptions(this_05,(Arena *)0x0);
      this_05 = this_05 + 1;
      lVar11 = lVar11 + -0x98;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value;
  if (IVar9 != iVar2) {
    this_06 = (EnumOptions *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9)
    ;
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      EnumOptions::EnumOptions(this_06,(Arena *)0x0);
      this_06 = this_06 + 1;
      lVar11 = lVar11 + -0x58;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
  if (IVar9 != iVar2) {
    this_07 = (EnumValueOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      EnumValueOptions::EnumValueOptions(this_07,(Arena *)0x0);
      this_07 = this_07 + 1;
      lVar11 = lVar11 + -0x60;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
  if (IVar9 != iVar2) {
    this_08 = (ExtensionRangeOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      ExtensionRangeOptions::ExtensionRangeOptions(this_08,(Arena *)0x0);
      this_08 = this_08 + 1;
      lVar11 = lVar11 + -0x70;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value;
  if (IVar9 != iVar2) {
    this_09 = (OneofOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      OneofOptions::OneofOptions(this_09,(Arena *)0x0);
      this_09 = this_09 + 1;
      lVar11 = lVar11 + -0x50;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
  if (IVar9 != iVar2) {
    this_10 = (ServiceOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      ServiceOptions::ServiceOptions(this_10,(Arena *)0x0);
      this_10 = this_10 + 1;
      lVar11 = lVar11 + -0x58;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value;
  if (IVar9 != iVar2) {
    this_11 = (MethodOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9);
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      MethodOptions::MethodOptions(this_11,(Arena *)0x0);
      this_11 = this_11 + 1;
      lVar11 = lVar11 + -0x58;
    } while (lVar11 != 0);
    IVar9 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value;
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FileOptions>.value;
  if (IVar9 != iVar2) {
    this_12 = (FileOptions *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)IVar9)
    ;
    lVar11 = (long)iVar2 - (long)IVar9;
    do {
      __n = 0;
      FileOptions::FileOptions(this_12,(Arena *)0x0);
      this_12 = this_12 + 1;
      lVar11 = lVar11 + -0xb0;
    } while (lVar11 != 0);
  }
  puVar4 = (this->flat_allocs_).
           super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 == (this->flat_allocs_).
                super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    puVar5 = (this->flat_allocs_).
             super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)puVar4 - (long)puVar5;
    if (lVar11 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar13 = lVar11 >> 3;
    uVar18 = uVar13 + (uVar13 == 0);
    this_01 = (_Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
               *)(uVar18 + uVar13);
    if ((_Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
         *)0xffffffffffffffe < this_01) {
      this_01 = (_Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                 *)0xfffffffffffffff;
    }
    if (CARRY8(uVar18,uVar13)) {
      this_01 = (_Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                 *)0xfffffffffffffff;
    }
    puVar14 = std::
              _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
              ::_M_allocate(this_01,__n);
    *(FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      **)((long)puVar14 + lVar11) = pFVar10;
    puVar39 = puVar14;
    for (this_00 = puVar5; this_00 != puVar4; this_00 = this_00 + 1) {
      (puVar39->_M_t).
      super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      .
      super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
      ._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
           .
           super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
           ._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      .
      super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
      ._M_head_impl =
           (FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            *)0x0;
      std::
      unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      ::~unique_ptr(this_00);
      puVar39 = puVar39 + 1;
    }
    if (puVar5 != (unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
                   *)0x0) {
      operator_delete(puVar5,(long)(this->flat_allocs_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5
                     );
    }
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar14;
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar39 + 1;
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar14 + (long)this_01;
  }
  else {
    (puVar4->_M_t).
    super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
    .
    super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
    ._M_head_impl = pFVar10;
    ppuVar1 = &(this->flat_allocs_).
               super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return pFVar10;
}

Assistant:

internal::FlatAllocator::Allocation* DescriptorPool::Tables::CreateFlatAlloc(
    const TypeMap<IntT, T...>& sizes) {
  auto ends = CalculateEnds(sizes);
  using FlatAlloc = internal::FlatAllocator::Allocation;

  int last_end = ends.template Get<
      typename std::tuple_element<sizeof...(T) - 1, std::tuple<T...>>::type>();
  size_t total_size =
      last_end + RoundUpTo<FlatAlloc::kMaxAlign>(sizeof(FlatAlloc));
  char* data = static_cast<char*>(::operator new(total_size));
  auto* res = ::new (data) FlatAlloc(ends);
  flat_allocs_.emplace_back(res);

  return res;
}